

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenType_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,Type *type,
          bool should_consider_suffix)

{
  bool bVar1;
  Type local_48;
  byte local_21;
  Type *pTStack_20;
  bool should_consider_suffix_local;
  Type *type_local;
  SwiftGenerator *this_local;
  
  local_21 = should_consider_suffix;
  pTStack_20 = type;
  type_local = (Type *)this;
  this_local = (SwiftGenerator *)__return_storage_ptr__;
  bVar1 = IsScalar(type->base_type);
  if (bVar1) {
    GenTypeBasic_abi_cxx11_(__return_storage_ptr__,this,pTStack_20);
  }
  else {
    bVar1 = IsArray(pTStack_20);
    if (bVar1) {
      Type::VectorType(&local_48,pTStack_20);
      GenType_abi_cxx11_(__return_storage_ptr__,this,&local_48,false);
    }
    else {
      GenTypePointer_abi_cxx11_(__return_storage_ptr__,this,pTStack_20,(bool)(local_21 & 1));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenType(const Type &type,
                      const bool should_consider_suffix = false) const {
    return IsScalar(type.base_type) ? GenTypeBasic(type)
           : IsArray(type)          ? GenType(type.VectorType())
                           : GenTypePointer(type, should_consider_suffix);
  }